

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase86::run(TestCase86 *this)

{
  unsigned_long uVar1;
  int local_78;
  bool local_71;
  int local_70;
  bool _kj_shouldLog_8;
  int local_68;
  bool _kj_shouldLog_7;
  int local_60;
  bool _kj_shouldLog_6;
  int local_58;
  bool _kj_shouldLog_5;
  int local_50;
  bool _kj_shouldLog_4;
  int local_48;
  bool _kj_shouldLog_3;
  int local_40;
  bool _kj_shouldLog_2;
  unsigned_long uStack_38;
  bool _kj_shouldLog_1;
  unsigned_long local_30;
  bool local_21;
  ShiftingWireValue<unsigned_long,_8UL> *pSStack_20;
  bool _kj_shouldLog;
  WireValue<uint64_t>_conflict *vals;
  byte bytes [8];
  TestCase86 *this_local;
  
  vals = (WireValue<uint64_t>_conflict *)0xf0debc9a78563412;
  pSStack_20 = (ShiftingWireValue<unsigned_long,_8UL> *)&vals;
  bytes = (byte  [8])this;
  uVar1 = ShiftingWireValue<unsigned_long,_8UL>::get(pSStack_20);
  if (uVar1 != 0xf0debc9a78563412) {
    local_21 = kj::_::Debug::shouldLog(ERROR);
    while (local_21 != false) {
      local_30 = 0xf0debc9a78563412;
      uStack_38 = ShiftingWireValue<unsigned_long,_8UL>::get(pSStack_20);
      kj::_::Debug::log<char_const(&)[57],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x5b,ERROR,
                 "\"failed: expected \" \"(0xf0debc9a78563412) == (vals[0].get())\", 0xf0debc9a78563412, vals[0].get()"
                 ,(char (*) [57])"failed: expected (0xf0debc9a78563412) == (vals[0].get())",
                 &local_30,&stack0xffffffffffffffc8);
      local_21 = false;
    }
  }
  ShiftingWireValue<unsigned_long,_8UL>::set(pSStack_20,0x23456789abcdef01);
  if ((char)vals != '\x01') {
    _kj_shouldLog_2 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      local_40 = 1;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"(0x01) == (bytes[0])\", 0x01, bytes[0]",
                 (char (*) [38])"failed: expected (0x01) == (bytes[0])",&local_40,(uchar *)&vals);
      _kj_shouldLog_2 = false;
    }
  }
  if (vals._1_1_ != -0x11) {
    _kj_shouldLog_3 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_48 = 0xef;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x60,ERROR,"\"failed: expected \" \"(0xef) == (bytes[1])\", 0xef, bytes[1]",
                 (char (*) [38])"failed: expected (0xef) == (bytes[1])",&local_48,
                 (uchar *)((long)&vals + 1));
      _kj_shouldLog_3 = false;
    }
  }
  if (vals._2_1_ != -0x33) {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_50 = 0xcd;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x61,ERROR,"\"failed: expected \" \"(0xcd) == (bytes[2])\", 0xcd, bytes[2]",
                 (char (*) [38])"failed: expected (0xcd) == (bytes[2])",&local_50,
                 (uchar *)((long)&vals + 2));
      _kj_shouldLog_4 = false;
    }
  }
  if (vals._3_1_ != -0x55) {
    _kj_shouldLog_5 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      local_58 = 0xab;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x62,ERROR,"\"failed: expected \" \"(0xab) == (bytes[3])\", 0xab, bytes[3]",
                 (char (*) [38])"failed: expected (0xab) == (bytes[3])",&local_58,
                 (uchar *)((long)&vals + 3));
      _kj_shouldLog_5 = false;
    }
  }
  if (vals._4_1_ != -0x77) {
    _kj_shouldLog_6 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      local_60 = 0x89;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"(0x89) == (bytes[4])\", 0x89, bytes[4]",
                 (char (*) [38])"failed: expected (0x89) == (bytes[4])",&local_60,
                 (uchar *)((long)&vals + 4));
      _kj_shouldLog_6 = false;
    }
  }
  if (vals._5_1_ != 'g') {
    _kj_shouldLog_7 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_7 != false) {
      local_68 = 0x67;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,100,ERROR,"\"failed: expected \" \"(0x67) == (bytes[5])\", 0x67, bytes[5]",
                 (char (*) [38])"failed: expected (0x67) == (bytes[5])",&local_68,
                 (uchar *)((long)&vals + 5));
      _kj_shouldLog_7 = false;
    }
  }
  if (vals._6_1_ != 'E') {
    _kj_shouldLog_8 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_8 != false) {
      local_70 = 0x45;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x65,ERROR,"\"failed: expected \" \"(0x45) == (bytes[6])\", 0x45, bytes[6]",
                 (char (*) [38])"failed: expected (0x45) == (bytes[6])",&local_70,
                 (uchar *)((long)&vals + 6));
      _kj_shouldLog_8 = false;
    }
  }
  if (vals._7_1_ != '#') {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_78 = 0x23;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x66,ERROR,"\"failed: expected \" \"(0x23) == (bytes[7])\", 0x23, bytes[7]",
                 (char (*) [38])"failed: expected (0x23) == (bytes[7])",&local_78,
                 (uchar *)((long)&vals + 7));
      local_71 = false;
    }
  }
  return;
}

Assistant:

TEST(Endian, EightBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};

  WireValue<uint64_t>* vals = reinterpret_cast<WireValue<uint64_t>*>(bytes);

  EXPECT_EQ(0xf0debc9a78563412, vals[0].get());

  vals[0].set(0x23456789abcdef01);

  EXPECT_EQ(0x01, bytes[0]);
  EXPECT_EQ(0xef, bytes[1]);
  EXPECT_EQ(0xcd, bytes[2]);
  EXPECT_EQ(0xab, bytes[3]);
  EXPECT_EQ(0x89, bytes[4]);
  EXPECT_EQ(0x67, bytes[5]);
  EXPECT_EQ(0x45, bytes[6]);
  EXPECT_EQ(0x23, bytes[7]);
}